

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListAppendList(Parse *pParse,SrcList *p1,SrcList *p2)

{
  sqlite3 *db;
  SrcList *in_RDX;
  sqlite3 *in_RSI;
  undefined8 in_RDI;
  SrcList *unaff_retaddr;
  SrcList *pNew;
  void *in_stack_ffffffffffffffd8;
  
  if (in_RDX != (SrcList *)0x0) {
    db = (sqlite3 *)
         sqlite3SrcListEnlarge((Parse *)pNew,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI)
    ;
    if (db == (sqlite3 *)0x0) {
      sqlite3SrcListDelete(in_RSI,in_RDX);
    }
    else {
      in_RSI = db;
      memcpy(&db->errCode,in_RDX->a,(long)in_RDX->nSrc * 0x48);
      sqlite3DbFree(db,in_stack_ffffffffffffffd8);
      ((anon_struct_4_19_bb8b771d_for_fg *)&in_RSI->aDb)->jointype =
           ((anon_struct_4_19_bb8b771d_for_fg *)&in_RSI->aDb)->jointype |
           in_RSI->bBenignMalloc & 0x40;
    }
  }
  return (SrcList *)in_RSI;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendList(Parse *pParse, SrcList *p1, SrcList *p2){
  assert( p1 && p1->nSrc==1 );
  if( p2 ){
    SrcList *pNew = sqlite3SrcListEnlarge(pParse, p1, p2->nSrc, 1);
    if( pNew==0 ){
      sqlite3SrcListDelete(pParse->db, p2);
    }else{
      p1 = pNew;
      memcpy(&p1->a[1], p2->a, p2->nSrc*sizeof(SrcItem));
      sqlite3DbFree(pParse->db, p2);
      p1->a[0].fg.jointype |= (JT_LTORJ & p1->a[1].fg.jointype);
    }
  }
  return p1;
}